

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

uint rtsp_conncheck(Curl_easy *data,connectdata *conn,uint checks_to_perform)

{
  _Bool _Var1;
  uint uVar2;
  _Bool input_pending;
  undefined8 uStack_8;
  
  uVar2 = 0;
  if ((checks_to_perform & 1) != 0) {
    uStack_8 = 0;
    _Var1 = Curl_conn_is_alive(data,conn,(_Bool *)((long)&uStack_8 + 7));
    uVar2 = (uint)!_Var1;
  }
  return uVar2;
}

Assistant:

static unsigned int rtsp_conncheck(struct Curl_easy *data,
                                   struct connectdata *conn,
                                   unsigned int checks_to_perform)
{
  unsigned int ret_val = CONNRESULT_NONE;
  (void)data;

  if(checks_to_perform & CONNCHECK_ISDEAD) {
    bool input_pending;
    if(!Curl_conn_is_alive(data, conn, &input_pending))
      ret_val |= CONNRESULT_DEAD;
  }

  return ret_val;
}